

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenInitializer::AddAutogenExecutableToDependencies
          (cmQtAutoGenInitializer *this,GenVarsT *genVars,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dependencies)

{
  string *__x;
  size_t *psVar1;
  __node_base *p_Var2;
  bool bVar3;
  string_view genexEnd;
  string_view genexBegin;
  string executableWithConfig;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  string local_90;
  size_t local_70;
  char *pcStack_68;
  size_t local_60;
  char *local_58;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *pcStack_38;
  
  if (genVars->ExecutableTarget != (cmGeneratorTarget *)0x0) {
    __x = cmTarget::GetName_abi_cxx11_(genVars->ExecutableTarget->Target);
LAB_002b2aee:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(dependencies,__x);
    return;
  }
  if ((this->MultiConfig == true) && (this->UseBetterGraph == true)) {
    local_40 = 0x1c;
    pcStack_38 = "$<COMMAND_CONFIG:$<$<CONFIG:";
    local_50 = 0xb;
    local_48 = "$<$<CONFIG:";
    local_60 = 1;
    local_58 = ">";
    local_70 = 2;
    pcStack_68 = ">>";
    bVar3 = this->CrossConfig != false;
    psVar1 = &local_50;
    if (bVar3) {
      psVar1 = &local_40;
    }
    local_a8._M_len = *psVar1;
    local_a8._M_str = (char *)psVar1[1];
    psVar1 = &local_60;
    if (bVar3) {
      psVar1 = &local_70;
    }
    local_b8._M_len = *psVar1;
    local_b8._M_str = (char *)psVar1[1];
    p_Var2 = &(genVars->Executable).Config._M_h._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&>
                (&local_90,&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1),
                 (char (*) [3])">:",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 5),
                 &local_b8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)dependencies,
                 &local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  else if ((genVars->Executable).Default._M_string_length != 0) {
    __x = &(genVars->Executable).Default;
    goto LAB_002b2aee;
  }
  return;
}

Assistant:

void cmQtAutoGenInitializer::AddAutogenExecutableToDependencies(
  cmQtAutoGenInitializer::GenVarsT const& genVars,
  std::vector<std::string>& dependencies) const
{
  if (genVars.ExecutableTarget != nullptr) {
    dependencies.push_back(genVars.ExecutableTarget->Target->GetName());
  } else if (this->MultiConfig && this->UseBetterGraph) {
    cm::string_view const& configGenexWithCommandConfig =
      "$<COMMAND_CONFIG:$<$<CONFIG:";
    cm::string_view const& configGenex = "$<$<CONFIG:";
    cm::string_view const& configGenexEnd = ">";
    cm::string_view const& configGenexEndWithCommandConfig = ">>";
    auto genexBegin =
      this->CrossConfig ? configGenexWithCommandConfig : configGenex;
    auto genexEnd =
      this->CrossConfig ? configGenexEndWithCommandConfig : configGenexEnd;
    for (auto const& config : genVars.Executable.Config) {
      auto executableWithConfig =
        cmStrCat(genexBegin, config.first, ">:", config.second, genexEnd);
      dependencies.emplace_back(std::move(executableWithConfig));
    }
  } else {
    if (!genVars.Executable.Default.empty()) {
      dependencies.push_back(genVars.Executable.Default);
    }
  }
}